

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

void flip_drawbridge_vertical(rm *loc)

{
  rm *loc_local;
  
  if ((loc->typ == '\x14') || (loc->typ == '$')) {
    if ((*(uint *)&loc->field_0x6 >> 4 & 3) == 0) {
      *(uint *)&loc->field_0x6 =
           *(uint *)&loc->field_0x6 & 0xfffffe0f | (*(uint *)&loc->field_0x6 >> 4 & 0x1f) << 4;
      *(uint *)&loc->field_0x6 =
           *(uint *)&loc->field_0x6 & 0xfffffe0f | (*(uint *)&loc->field_0x6 >> 4 & 0x1f | 1) << 4;
    }
    else if ((*(uint *)&loc->field_0x6 >> 4 & 3) == 1) {
      *(uint *)&loc->field_0x6 =
           *(uint *)&loc->field_0x6 & 0xfffffe0f | (*(uint *)&loc->field_0x6 >> 4 & 0x1e) << 4;
      *(uint *)&loc->field_0x6 =
           *(uint *)&loc->field_0x6 & 0xfffffe0f | (*(uint *)&loc->field_0x6 >> 4 & 0x1f) << 4;
    }
  }
  return;
}

Assistant:

static void flip_drawbridge_vertical(struct rm *loc)
{
	if (IS_DRAWBRIDGE(loc->typ)) {
	    if ((loc->drawbridgemask & DB_DIR) == DB_NORTH) {
		loc->drawbridgemask &= ~DB_NORTH;
		loc->drawbridgemask |=  DB_SOUTH;
	    } else if ((loc->drawbridgemask & DB_DIR) == DB_SOUTH) {
		loc->drawbridgemask &= ~DB_SOUTH;
		loc->drawbridgemask |=  DB_NORTH;
	    }
	}
}